

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_snapshot_sync.cxx
# Opt level: O1

void __thiscall nuraft::raft_server::handle_install_snapshot_resp(raft_server *this,resp_msg *resp)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  uint uVar2;
  element_type *peVar3;
  ulong uVar4;
  peer *pp;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar5;
  __int_type _Var6;
  element_type *peVar7;
  int iVar8;
  int iVar9;
  _Hash_node_base *p_Var10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  char *pcVar11;
  ulong uVar12;
  peer *this_01;
  __node_base_ptr p_Var13;
  __node_base_ptr p_Var14;
  bool bVar15;
  bool bVar16;
  ptr<snapshot_sync_ctx> sync_ctx;
  undefined1 local_78 [32];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  snapshot_sync_ctx *local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  peer *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((peVar3 != (element_type *)0x0) && (iVar8 = (*peVar3->_vptr_logger[7])(), 4 < iVar8)) {
    peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    pcVar11 = "not accepted";
    if (resp->accepted_ != false) {
      pcVar11 = "accepted";
    }
    msg_if_given_abi_cxx11_((string *)local_78,"%s\n",pcVar11);
    (*peVar3->_vptr_logger[8])
              (peVar3,5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
               ,"handle_install_snapshot_resp",0x148,(string *)local_78);
    if ((peer *)local_78._0_8_ != (peer *)(local_78 + 0x10)) {
      operator_delete((void *)local_78._0_8_);
    }
  }
  iVar8 = (resp->super_msg_base).src_;
  uVar4 = (this->peers_)._M_h._M_bucket_count;
  uVar12 = (ulong)(long)iVar8 % uVar4;
  p_Var13 = (this->peers_)._M_h._M_buckets[uVar12];
  p_Var14 = (__node_base_ptr)0x0;
  if ((p_Var13 != (__node_base_ptr)0x0) &&
     (p_Var10 = p_Var13->_M_nxt, p_Var14 = p_Var13, iVar8 != *(int *)&p_Var13->_M_nxt[1]._M_nxt)) {
    while (p_Var13 = p_Var10, p_Var10 = p_Var13->_M_nxt, p_Var10 != (_Hash_node_base *)0x0) {
      p_Var14 = (__node_base_ptr)0x0;
      if (((ulong)(long)*(int *)&p_Var10[1]._M_nxt % uVar4 != uVar12) ||
         (p_Var14 = p_Var13, iVar8 == *(int *)&p_Var10[1]._M_nxt)) goto LAB_001a3f99;
    }
    p_Var14 = (__node_base_ptr)0x0;
  }
LAB_001a3f99:
  if (p_Var14 == (__node_base_ptr)0x0) {
    p_Var10 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var10 = p_Var14->_M_nxt;
  }
  if (p_Var10 == (_Hash_node_base *)0x0) {
    peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar3 != (element_type *)0x0) && (iVar8 = (*peVar3->_vptr_logger[7])(), 3 < iVar8)) {
      peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                ((string *)local_78,"the response is from an unknown peer %d",
                 (ulong)(uint)(resp->super_msg_base).src_);
      (*peVar3->_vptr_logger[8])
                (peVar3,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                 ,"handle_install_snapshot_resp",0x14b,(string *)local_78);
      if ((peer *)local_78._0_8_ != (peer *)(local_78 + 0x10)) {
        operator_delete((void *)local_78._0_8_);
      }
    }
  }
  else {
    pp = (peer *)p_Var10[2]._M_nxt;
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var10[3]._M_nxt;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    if (resp->accepted_ == true) {
      iVar8 = pthread_mutex_lock((pthread_mutex_t *)&pp->lock_);
      if (iVar8 != 0) {
        std::__throw_system_error(iVar8);
      }
      this_01 = (peer *)&stack0xffffffffffffffb0;
      peer::get_snapshot_sync_ctx(this_01);
      if (local_50 == (snapshot_sync_ctx *)0x0) {
        peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if ((peVar3 != (element_type *)0x0) && (iVar8 = (*peVar3->_vptr_logger[7])(), 3 < iVar8)) {
          peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          msg_if_given_abi_cxx11_
                    ((string *)local_78,"no snapshot sync context for this peer, drop the response")
          ;
          (*peVar3->_vptr_logger[8])
                    (peVar3,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                     ,"handle_install_snapshot_resp",0x157,local_78);
          if ((peer *)local_78._0_8_ != (peer *)(local_78 + 0x10)) {
            operator_delete((void *)local_78._0_8_);
          }
        }
        bVar15 = false;
      }
      else {
        peVar5 = (local_50->snapshot_).
                 super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_58 = (local_50->snapshot_).
                   super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi;
        if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            local_58->_M_use_count = local_58->_M_use_count + 1;
            UNLOCK();
          }
          else {
            local_58->_M_use_count = local_58->_M_use_count + 1;
          }
        }
        if (((peVar5->type_ == raw_binary) &&
            (this_01 = (peer *)(this->l_).
                               super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            , this_01 != (peer *)0x0)) &&
           (iVar8 = (*(code *)(((this_01->config_).
                                super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->aux_).field_2._M_allocated_capacity)(), 4 < iVar8)) {
          peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          msg_if_given_abi_cxx11_
                    ((string *)local_78,"resp.get_next_idx(): %lu, snp->size(): %lu",resp->next_idx_
                     ,peVar5->size_);
          (*peVar3->_vptr_logger[8])
                    (peVar3,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                     ,"handle_install_snapshot_resp",0x15f,local_78);
          this_01 = (peer *)local_78._0_8_;
          if ((peer *)local_78._0_8_ != (peer *)(local_78 + 0x10)) {
            operator_delete((void *)local_78._0_8_);
          }
        }
        if (peVar5->type_ == logical_object) {
          peVar7 = (resp->ctx_).super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          this_01 = (peer *)(resp->ctx_).
                            super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi;
          if (this_01 != (peer *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var1 = &(this_01->config_).
                        super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount;
              *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
              UNLOCK();
            }
            else {
              p_Var1 = &(this_01->config_).
                        super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount;
              *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
            }
          }
          bVar16 = peVar7 != (element_type *)0x0;
          bVar15 = false;
        }
        else if (peVar5->type_ == raw_binary) {
          bVar15 = true;
          if (resp->next_idx_ < peVar5->size_) {
            bVar16 = false;
          }
          else {
            bVar16 = true;
          }
        }
        else {
          bVar16 = false;
          bVar15 = true;
        }
        if (this_01 != (peer *)0x0 && !bVar15) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
        }
        peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (bVar16) {
          if ((peVar3 != (element_type *)0x0) && (iVar8 = (*peVar3->_vptr_logger[7])(), 4 < iVar8))
          {
            peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            msg_if_given_abi_cxx11_((string *)local_78,"snapshot sync is done (raw type)");
            (*peVar3->_vptr_logger[8])
                      (peVar3,5,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                       ,"handle_install_snapshot_resp",0x16a,local_78);
            if ((peer *)local_78._0_8_ != (peer *)(local_78 + 0x10)) {
              operator_delete((void *)local_78._0_8_);
            }
          }
          LOCK();
          (pp->next_log_idx_).super___atomic_base<unsigned_long>._M_i =
               ((local_50->snapshot_).
                super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               last_log_idx_ + 1;
          UNLOCK();
          pp->matched_idx_ =
               ((local_50->snapshot_).
                super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               last_log_idx_;
          clear_snapshot_sync_ctx(this,pp);
          bVar15 = true;
          LOCK();
          bVar16 = (pp->pending_commit_flag_)._M_base._M_i == true;
          if (bVar16) {
            (pp->pending_commit_flag_)._M_base._M_i = false;
          }
          UNLOCK();
          if (!bVar16) {
            uVar4 = (pp->next_log_idx_).super___atomic_base<unsigned_long>._M_i;
            iVar8 = (*((this->log_store_).
                       super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                      _vptr_log_store[2])();
            bVar15 = uVar4 < CONCAT44(extraout_var_01,iVar8);
          }
          peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if ((peVar3 != (element_type *)0x0) && (iVar8 = (*peVar3->_vptr_logger[7])(), 3 < iVar8))
          {
            peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            msg_if_given_abi_cxx11_
                      ((string *)local_78,"snapshot done %lu, %lu, %d",
                       (pp->next_log_idx_).super___atomic_base<unsigned_long>._M_i,pp->matched_idx_,
                       (ulong)bVar15);
            (*peVar3->_vptr_logger[8])
                      (peVar3,4,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                       ,"handle_install_snapshot_resp",0x172,local_78);
            if ((peer *)local_78._0_8_ != (peer *)(local_78 + 0x10)) {
              operator_delete((void *)local_78._0_8_);
            }
          }
        }
        else {
          if ((peVar3 != (element_type *)0x0) && (iVar8 = (*peVar3->_vptr_logger[7])(), 4 < iVar8))
          {
            peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            msg_if_given_abi_cxx11_
                      ((string *)local_78,"continue to sync snapshot at offset %lu",resp->next_idx_)
            ;
            (*peVar3->_vptr_logger[8])
                      (peVar3,5,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                       ,"handle_install_snapshot_resp",0x175,local_78);
            if ((peer *)local_78._0_8_ != (peer *)(local_78 + 0x10)) {
              operator_delete((void *)local_78._0_8_);
            }
          }
          bVar15 = true;
          snapshot_sync_ctx::set_offset(local_50,resp->next_idx_);
        }
        if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
        }
      }
      if (local_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48._M_pi);
      }
    }
    else {
      peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar3 != (element_type *)0x0) && (iVar8 = (*peVar3->_vptr_logger[7])(), 2 < iVar8)) {
        peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        uVar2 = ((pp->config_).super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->id_;
        _Var6 = (pp->next_log_idx_).super___atomic_base<unsigned_long>._M_i;
        iVar8 = (*((this->log_store_).
                   super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  _vptr_log_store[2])();
        msg_if_given_abi_cxx11_
                  ((string *)local_78,
                   "peer %d declined snapshot: p->get_next_log_idx(): %lu, log_store_->next_slot(): %lu"
                   ,(ulong)uVar2,_Var6,CONCAT44(extraout_var,iVar8));
        (*peVar3->_vptr_logger[8])
                  (peVar3,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                   ,"handle_install_snapshot_resp",0x17d,local_78);
        if ((peer *)local_78._0_8_ != (peer *)(local_78 + 0x10)) {
          operator_delete((void *)local_78._0_8_);
        }
      }
      LOCK();
      (pp->next_log_idx_).super___atomic_base<unsigned_long>._M_i = resp->next_idx_;
      UNLOCK();
      uVar4 = (pp->next_log_idx_).super___atomic_base<unsigned_long>._M_i;
      iVar8 = (*((this->log_store_).
                 super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                _vptr_log_store[2])();
      iVar9 = pthread_mutex_lock((pthread_mutex_t *)&pp->lock_);
      if (iVar9 != 0) {
        std::__throw_system_error(iVar9);
      }
      bVar15 = uVar4 < CONCAT44(extraout_var_00,iVar8);
      clear_snapshot_sync_ctx(this,pp);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&pp->lock_);
    if ((bVar15 != false) && ((this->role_)._M_i == leader)) {
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      local_40 = pp;
      local_38._M_pi = this_00;
      request_append_entries(this,(ptr<peer> *)&stack0xffffffffffffffc0);
      if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
      }
    }
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
  }
  return;
}

Assistant:

void raft_server::handle_install_snapshot_resp(resp_msg& resp) {
    p_db("%s\n", resp.get_accepted() ? "accepted" : "not accepted");
    peer_itor it = peers_.find(resp.get_src());
    if (it == peers_.end()) {
        p_in("the response is from an unknown peer %d", resp.get_src());
        return;
    }

    // if there are pending logs to be synced or commit index need to be advanced,
    // continue to send appendEntries to this peer
    bool need_to_catchup = true;
    ptr<peer> p = it->second;
    if (resp.get_accepted()) {
        std::lock_guard<std::mutex> guard(p->get_lock());
        ptr<snapshot_sync_ctx> sync_ctx = p->get_snapshot_sync_ctx();
        if (sync_ctx == nullptr) {
            p_in("no snapshot sync context for this peer, drop the response");
            need_to_catchup = false;

        } else {
            ptr<snapshot> snp = sync_ctx->get_snapshot();
            if (snp->get_type() == snapshot::raw_binary) {
                // LCOV_EXCL_START
                p_db("resp.get_next_idx(): %" PRIu64 ", snp->size(): %" PRIu64,
                     resp.get_next_idx(), snp->size());
                // LCOV_EXCL_STOP
            }

            bool snp_install_done =
                 ( snp->get_type() == snapshot::raw_binary &&
                   resp.get_next_idx() >= snp->size() )           ||
                 ( snp->get_type() == snapshot::logical_object &&
                   resp.get_ctx() );

            if (snp_install_done) {
                p_db("snapshot sync is done (raw type)");
                p->set_next_log_idx(sync_ctx->get_snapshot()->get_last_log_idx() + 1);
                p->set_matched_idx(sync_ctx->get_snapshot()->get_last_log_idx());
                clear_snapshot_sync_ctx(*p);

                need_to_catchup = p->clear_pending_commit() ||
                                  p->get_next_log_idx() < log_store_->next_slot();
                p_in("snapshot done %" PRIu64 ", %" PRIu64 ", %d",
                     p->get_next_log_idx(), p->get_matched_idx(), need_to_catchup);
            } else {
                p_db("continue to sync snapshot at offset %" PRIu64,
                     resp.get_next_idx());
                sync_ctx->set_offset(resp.get_next_idx());
            }
        }

    } else {
        p_wn( "peer %d declined snapshot: p->get_next_log_idx(): %" PRIu64 ", "
              "log_store_->next_slot(): %" PRIu64,
              p->get_id(), p->get_next_log_idx(), log_store_->next_slot() );
        p->set_next_log_idx(resp.get_next_idx());

        // Added by Jung-Sang Ahn (Oct 11 2017)
        // Declining snapshot implies that the peer already has the up-to-date snapshot.
        need_to_catchup = p->get_next_log_idx() < log_store_->next_slot();

        // Should reset current snapshot context,
        // to continue with more recent snapshot.
        std::lock_guard<std::mutex> guard(p->get_lock());
        clear_snapshot_sync_ctx(*p);
    }

    // This may not be a leader anymore, such as
    // the response was sent out long time ago
    // and the role was updated by UpdateTerm call
    // Try to match up the logs for this peer
    if (role_ == srv_role::leader && need_to_catchup) {
        request_append_entries(p);
    }
}